

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void * do_realloc_nonnull_zero(void *ptr)

{
  rtree_ctx_cache_elm_t *prVar1;
  ulong *puVar2;
  rtree_leaf_elm_t *prVar3;
  size_t __n;
  uint64_t uVar4;
  rtree_leaf_elm_t *prVar5;
  ushort uVar6;
  void *pvVar7;
  tsd_t *tsd;
  rtree_leaf_elm_t *prVar8;
  void **ppvVar9;
  cache_bin_t *bin;
  cache_bin_t *cache_bin;
  ulong uVar10;
  rtree_ctx_cache_elm_t *prVar11;
  rtree_ctx_cache_elm_t *prVar12;
  uintptr_t in_R8;
  undefined7 uVar13;
  rtree_ctx_t *ctx;
  ulong uVar14;
  tcache_t *tcache;
  rtree_t *rtree;
  uintptr_t args [3];
  rtree_ctx_t rtree_ctx_fallback;
  void *local_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  rtree_contents_t local_1c8;
  _Bool local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  
  LOCK();
  duckdb_je_zero_realloc_count.repr = duckdb_je_zero_realloc_count.repr + 1;
  UNLOCK();
  if (duckdb_je_opt_zero_realloc_action != zero_realloc_action_free) {
    if (duckdb_je_opt_zero_realloc_action != zero_realloc_action_alloc) {
      duckdb_je_safety_check_fail("Called realloc(non-null-ptr, 0) with zero_realloc:abort set\n");
      return (void *)0x0;
    }
    pvVar7 = do_rallocx(ptr,1,0x100,true);
    return pvVar7;
  }
  tsd = (tsd_t *)__tls_get_addr(&PTR_024e0b60);
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,false);
  }
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level == '\0') {
    tcache = (tcache_t *)0x0;
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
      tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
    }
  }
  else {
    tcache = (tcache_t *)0x0;
  }
  local_1e0 = 0;
  uStack_1d8 = 0;
  local_1e8 = ptr;
  duckdb_je_hook_invoke_dalloc(hook_dalloc_realloc,ptr,(uintptr_t *)&local_1e8);
  if (tsd == (tsd_t *)0x0) {
    ctx = (rtree_ctx_t *)&stack0xfffffffffffffe50;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  prVar8 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
  uVar14 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar2 = (ulong *)((long)&ctx->cache[0].leafkey + uVar14);
  prVar3 = *(rtree_leaf_elm_t **)((long)&ctx->cache[0].leafkey + uVar14);
  if (prVar3 == prVar8) {
    prVar8 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if ((rtree_leaf_elm_t *)ctx->l2_cache[0].leafkey == prVar8) {
    prVar5 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = (uintptr_t)prVar3;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = (ulong)prVar8;
    puVar2[1] = (ulong)prVar5;
    prVar8 = (rtree_leaf_elm_t *)
             ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar11 = ctx->l2_cache + 1;
    if ((rtree_leaf_elm_t *)ctx->l2_cache[1].leafkey == prVar8) {
      uVar10 = 0;
      in_R8 = 0;
    }
    else {
      uVar14 = 1;
      prVar12 = prVar11;
      do {
        uVar10 = uVar14;
        uVar13 = (undefined7)(in_R8 >> 8);
        if (uVar10 == 7) {
          in_R8 = CONCAT71(uVar13,6 < uVar10);
          goto LAB_01c61c03;
        }
        prVar11 = prVar12 + 1;
        prVar1 = prVar12 + 1;
        uVar14 = uVar10 + 1;
        prVar12 = prVar11;
      } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar8);
      in_R8 = CONCAT71(uVar13,6 < uVar10);
    }
    prVar5 = prVar11->leaf;
    prVar11->leafkey = ctx->l2_cache[uVar10].leafkey;
    prVar11->leaf = ctx->l2_cache[uVar10].leaf;
    ctx->l2_cache[uVar10].leafkey = (uintptr_t)prVar3;
    ctx->l2_cache[uVar10].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = (ulong)prVar8;
    puVar2[1] = (ulong)prVar5;
    prVar8 = (rtree_leaf_elm_t *)
             ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_01c61c03:
    if ((char)in_R8 != '\0') {
      in_R8 = 1;
      prVar8 = duckdb_je_rtree_leaf_elm_lookup_hard
                         ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)ptr,true,
                          false);
    }
  }
  pvVar7 = (prVar8->le_bits).repr;
  uVar14 = (ulong)pvVar7 >> 0x30;
  __n = duckdb_je_sz_index2size_tab[uVar14];
  if (duckdb_je_opt_junk_free == true) {
    switchD_0105dc25::default(ptr,0x5a,__n);
  }
  if (tcache == (tcache_t *)0x0) {
    arena_dalloc_no_tcache((tsdn_t *)tsd,ptr);
    goto LAB_01c619cf;
  }
  uVar6 = (ushort)((ulong)pvVar7 >> 0x30);
  if (((ulong)pvVar7 & 1) == 0) {
    if ((tcache->tcache_slow->tcache_nbins <= (uint)uVar6) ||
       (ppvVar9 = tcache->bins[uVar14].stack_head, ppvVar9 == (void **)&duckdb_je_disabled_bin)) {
      if (tsd == (tsd_t *)0x0) {
        rtree = (rtree_t *)&stack0xfffffffffffffe50;
        duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
      }
      else {
        rtree = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      rtree_read(&local_1c8,(tsdn_t *)tsd,rtree,(rtree_ctx_t *)ptr,in_R8);
      duckdb_je_large_dalloc((tsdn_t *)tsd,local_1c8.edata);
      goto LAB_01c619cf;
    }
    cache_bin = tcache->bins + uVar14;
    if (tcache->bins[uVar14].low_bits_full == (uint16_t)ppvVar9) {
      duckdb_je_tcache_bin_flush_large
                (tsd,tcache,cache_bin,(uint)uVar6,
                 (uint)(tcache->bins[uVar14].bin_info.ncached_max >>
                       ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
      goto LAB_01c61b5c;
    }
  }
  else {
    cache_bin = tcache->bins + uVar14;
    ppvVar9 = cache_bin->stack_head;
    if (tcache->bins[uVar14].low_bits_full == (uint16_t)ppvVar9) {
      if (cache_bin->stack_head == (void **)&duckdb_je_disabled_bin) {
        duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
        goto LAB_01c619cf;
      }
      duckdb_je_tcache_bin_flush_small
                (tsd,tcache,cache_bin,(uint)uVar6,
                 (uint)(tcache->bins[uVar14].bin_info.ncached_max >>
                       ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01c61b5c:
      ppvVar9 = cache_bin->stack_head;
      if (cache_bin->low_bits_full == (uint16_t)ppvVar9) goto LAB_01c619cf;
    }
  }
  cache_bin->stack_head = ppvVar9 + -1;
  ppvVar9[-1] = ptr;
LAB_01c619cf:
  local_1b0 = false;
  local_1a8 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  local_1a0 = &tsd->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event;
  local_198 = &tsd->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event;
  local_190 = &tsd->
               cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast
  ;
  uVar4 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar4 + __n;
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
      uVar4 <= __n) {
    duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&stack0xfffffffffffffe50);
  }
  return (void *)0x0;
}

Assistant:

static void *
do_realloc_nonnull_zero(void *ptr) {
	if (config_stats) {
		atomic_fetch_add_zu(&zero_realloc_count, 1, ATOMIC_RELAXED);
	}
	if (opt_zero_realloc_action == zero_realloc_action_alloc) {
		/*
		 * The user might have gotten an alloc setting while expecting a
		 * free setting.  If that's the case, we at least try to
		 * reduce the harm, and turn off the tcache while allocating, so
		 * that we'll get a true first fit.
		 */
		return do_rallocx(ptr, 1, MALLOCX_TCACHE_NONE, true);
	} else if (opt_zero_realloc_action == zero_realloc_action_free) {
		UTRACE(ptr, 0, 0);
		tsd_t *tsd = tsd_fetch();
		check_entry_exit_locking(tsd_tsdn(tsd));

		tcache_t *tcache = tcache_get_from_ind(tsd,
		    TCACHE_IND_AUTOMATIC, /* slow */ true,
		    /* is_alloc */ false);
		uintptr_t args[3] = {(uintptr_t)ptr, 0};
		hook_invoke_dalloc(hook_dalloc_realloc, ptr, args);
		ifree(tsd, ptr, tcache, true);

		check_entry_exit_locking(tsd_tsdn(tsd));
		return NULL;
	} else {
		safety_check_fail("Called realloc(non-null-ptr, 0) with "
		    "zero_realloc:abort set\n");
		/* In real code, this will never run; the safety check failure
		 * will call abort.  In the unit test, we just want to bail out
		 * without corrupting internal state that the test needs to
		 * finish.
		 */
		return NULL;
	}
}